

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::CSMImporter::CanRead(CSMImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *tokens [1];
  string extension;
  char *local_48;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    if (checkSig) {
      if (pIOHandler == (IOSystem *)0x0) {
        bVar1 = false;
        goto LAB_0041f41b;
      }
    }
    else {
      bVar1 = false;
      if ((pIOHandler == (IOSystem *)0x0) || (local_40._M_string_length != 0)) goto LAB_0041f41b;
    }
    local_48 = "$Filename";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_48,1,200,false,false);
  }
LAB_0041f41b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool CSMImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "csm")
        return true;

    if ((checkSig || !extension.length()) && pIOHandler) {
        const char* tokens[] = {"$Filename"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}